

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_table.cpp
# Opt level: O0

void __thiscall
ArrayTable_MultipleKeys_Test::~ArrayTable_MultipleKeys_Test(ArrayTable_MultipleKeys_Test *this)

{
  ArrayTable_MultipleKeys_Test *this_local;
  
  ~ArrayTable_MultipleKeys_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ArrayTable, MultipleKeys) {
    std::istringstream input("[[table.123.\"table\\ntable\"]]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table_array_item, {"table", "123", "table\ntable"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}